

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O2

ssize_t mqtt_unpack_connack_response(mqtt_response *mqtt_response,uint8_t *buf)

{
  ssize_t sVar1;
  
  sVar1 = -0x7ffffff4;
  if ((mqtt_response->fixed_header).remaining_length == 2) {
    sVar1 = -0x7ffffff8;
    if (*buf < 2) {
      (mqtt_response->decoded).connack.session_present_flag = *buf;
      sVar1 = -0x7ffffff7;
      if (buf[1] < (MQTT_CONNACK_REFUSED_BAD_USER_NAME_OR_PASSWORD|
                   MQTT_CONNACK_REFUSED_IDENTIFIER_REJECTED)) {
        (mqtt_response->decoded).connack.return_code = (uint)buf[1];
        sVar1 = 2;
      }
    }
  }
  return sVar1;
}

Assistant:

ssize_t mqtt_unpack_connack_response(struct mqtt_response *mqtt_response, const uint8_t *buf) {
    const uint8_t *const start = buf;
    struct mqtt_response_connack *response;

    /* check that remaining length is 2 */
    if (mqtt_response->fixed_header.remaining_length != 2) {
        return MQTT_ERROR_MALFORMED_RESPONSE;
    }
    
    response = &(mqtt_response->decoded.connack);
    /* unpack */
    if (*buf & 0xFE) {
        /* only bit 1 can be set */
        return MQTT_ERROR_CONNACK_FORBIDDEN_FLAGS;
    } else {
        response->session_present_flag = *buf++;
    }

    if (*buf > 5u) {
        /* only bit 1 can be set */
        return MQTT_ERROR_CONNACK_FORBIDDEN_CODE;
    } else {
        response->return_code = (enum MQTTConnackReturnCode) *buf++;
    }
    return buf - start;
}